

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

void __thiscall
Memory::PageSegmentBase<Memory::VirtualAllocWrapper>::ReleasePages
          (PageSegmentBase<Memory::VirtualAllocWrapper> *this,void *address,uint pageCount)

{
  undefined4 *puVar1;
  HANDLE pVVar2;
  code *pcVar3;
  bool bVar4;
  BVIndex BVar5;
  BOOL BVar6;
  undefined8 in_RAX;
  PageAllocatorBaseCommon *pPVar7;
  HANDLE pVVar8;
  AllocatorType *pAVar9;
  BVIndex BVar10;
  undefined8 *in_FS_OFFSET;
  DWORD local_34 [2];
  DWORD oldProtect;
  
  local_34[0] = (DWORD)((ulong)in_RAX >> 0x20);
  if (address < (this->super_SegmentBase<Memory::VirtualAllocWrapper>).address) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x1dc,"(address >= this->address)","address >= this->address");
    if (!bVar4) goto LAB_00271959;
    *puVar1 = 0;
  }
  pPVar7 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.allocator;
  pAVar9 = &pPVar7[-1].allocatorType;
  if (pPVar7 == (PageAllocatorBaseCommon *)0x0) {
    pAVar9 = (AllocatorType *)0x0;
  }
  if (pAVar9[0x28] < pageCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x1dd,"(pageCount <= this->GetAllocator()->maxAllocPageCount)",
                       "pageCount <= this->GetAllocator()->maxAllocPageCount");
    if (!bVar4) goto LAB_00271959;
    *puVar1 = 0;
    pPVar7 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.
             allocator;
  }
  pAVar9 = &pPVar7[-1].allocatorType;
  if (pPVar7 == (PageAllocatorBaseCommon *)0x0) {
    pAVar9 = (AllocatorType *)0x0;
  }
  if ((pAVar9[0x28] - pageCount) * 0x1000 <
      (uint)((int)address - *(int *)&(this->super_SegmentBase<Memory::VirtualAllocWrapper>).address)
     ) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x1de,
                       "(((uint)(((char *)address) - this->address)) <= (this->GetAllocator()->maxAllocPageCount - pageCount) * AutoSystemInfo::PageSize)"
                       ,
                       "((uint)(((char *)address) - this->address)) <= (this->GetAllocator()->maxAllocPageCount - pageCount) * AutoSystemInfo::PageSize"
                      );
    if (!bVar4) goto LAB_00271959;
    *puVar1 = 0;
  }
  bVar4 = IsFreeOrDecommitted(this,address,pageCount);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x1df,"(!IsFreeOrDecommitted(address, pageCount))",
                       "!IsFreeOrDecommitted(address, pageCount)");
    if (!bVar4) goto LAB_00271959;
    *puVar1 = 0;
  }
  BVStatic<272UL>::SetRange
            (&this->freePages,
             (uint)((int)address -
                   *(int *)&(this->super_SegmentBase<Memory::VirtualAllocWrapper>).address) >> 0xc,
             pageCount);
  BVar10 = this->freePageCount + pageCount;
  this->freePageCount = BVar10;
  BVar5 = BVStatic<272UL>::Count(&this->freePages);
  if (BVar10 != BVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x1e4,"(freePageCount == (uint)this->GetCountOfFreePages())",
                       "freePageCount == (uint)this->GetCountOfFreePages()");
    if (!bVar4) goto LAB_00271959;
    *puVar1 = 0;
  }
  pPVar7 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.allocator;
  pAVar9 = &pPVar7[-1].allocatorType;
  if (pPVar7 == (PageAllocatorBaseCommon *)0x0) {
    pAVar9 = (AllocatorType *)0x0;
  }
  pVVar2 = *(HANDLE *)(pAVar9 + 0x4a);
  pVVar8 = GetCurrentProcess();
  if (pVVar2 == pVVar8) {
    BVar6 = VirtualProtect(address,(ulong)(pageCount << 0xc),1,local_34);
    if (BVar6 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x1eb,"(vpresult != 0)","vpresult != FALSE");
      if (!bVar4) goto LAB_00271959;
      *puVar1 = 0;
    }
    if (local_34[0] != 4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x1ec,"(oldProtect == 0x04)","oldProtect == PAGE_READWRITE");
      if (!bVar4) {
LAB_00271959:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar1 = 0;
    }
  }
  return;
}

Assistant:

void
PageSegmentBase<T>::ReleasePages(__in void * address, uint pageCount)
{
    Assert(address >= this->address);
    Assert(pageCount <= this->GetAllocator()->maxAllocPageCount);
    Assert(((uint)(((char *)address) - this->address)) <= (this->GetAllocator()->maxAllocPageCount - pageCount) *  AutoSystemInfo::PageSize);
    Assert(!IsFreeOrDecommitted(address, pageCount));

    uint base = this->GetBitRangeBase(address);
    this->SetRangeInFreePagesBitVector(base, pageCount);
    this->freePageCount += pageCount;
    Assert(freePageCount == (uint)this->GetCountOfFreePages());

#ifdef PAGEALLOCATOR_PROTECT_FREEPAGE
    if (this->GetAllocator()->processHandle == GetCurrentProcess())
    {
        DWORD oldProtect;
        BOOL vpresult = VirtualProtect(address, pageCount * AutoSystemInfo::PageSize, PAGE_NOACCESS, &oldProtect);
        Assert(vpresult != FALSE);
        Assert(oldProtect == PAGE_READWRITE);
    }
#endif

}